

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::torrent_update_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,torrent_update_alert *this)

{
  long lVar1;
  _Alloc_hider _Var2;
  long *plVar3;
  difference_type in_RCX;
  size_type *psVar4;
  span<const_char> in;
  span<const_char> in_00;
  char msg [200];
  string local_128;
  string local_108;
  char local_e8 [200];
  
  in.m_len = in_RCX;
  in.m_ptr = (char *)0x14;
  aux::to_hex_abi_cxx11_(&local_128,(aux *)&this->old_ih,in);
  _Var2._M_p = local_128._M_dataplus._M_p;
  in_00.m_len = in_RCX;
  in_00.m_ptr = (char *)0x14;
  aux::to_hex_abi_cxx11_(&local_108,(aux *)&this->new_ih,in_00);
  snprintf(local_e8,200," torrent changed info-hash from: %s to %s",_Var2._M_p,
           local_108._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  torrent_alert::message_abi_cxx11_(&local_128,&this->super_torrent_alert);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_128);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string torrent_update_alert::message() const
	{
		char msg[200];
		std::snprintf(msg, sizeof(msg), " torrent changed info-hash from: %s to %s"
			, aux::to_hex(old_ih).c_str()
			, aux::to_hex(new_ih).c_str());
		return torrent_alert::message() + msg;
	}